

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_connect(connectdata *conn,_Bool *done)

{
  char *pcVar1;
  uint *sasl;
  uint uVar2;
  char cVar3;
  int iVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  char *value;
  char *first;
  size_t len;
  char *pcVar7;
  bool bVar8;
  
  *done = false;
  CVar6 = CURLE_OK;
  Curl_conncontrol(conn,0);
  (conn->proto).ftpc.pp.response_time = 120000;
  (conn->proto).ftpc.pp.statemach_act = pop3_statemach_act;
  (conn->proto).ftpc.pp.endofresp = pop3_endofresp;
  (conn->proto).ftpc.pp.conn = conn;
  (conn->proto).ftpc.count1 = -1;
  sasl = &(conn->proto).imapc.sasl.prefmech;
  Curl_sasl_init((SASL *)sasl,&saslpop3);
  Curl_pp_init(&(conn->proto).ftpc.pp);
  first = conn->options;
  (conn->proto).imapc.resptag[0] = '\x01';
  while( true ) {
    bVar8 = CVar6 == CURLE_OK;
    if ((!bVar8) || (first == (char *)0x0)) goto LAB_00131b7b;
    cVar3 = *first;
    pcVar7 = first;
    if (cVar3 == '\0') break;
    while ((value = pcVar7 + 1, cVar3 != '\0' && (cVar3 != '='))) {
      pcVar7 = value;
      cVar3 = *value;
    }
    len = 0xffffffffffffffff;
    while ((cVar3 != '\0' && (cVar3 != ';'))) {
      pcVar1 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
      len = len + 1;
      cVar3 = *pcVar1;
    }
    iVar4 = Curl_strncasecompare(first,"AUTH=",5);
    CVar6 = CURLE_URL_MALFORMAT;
    if (iVar4 != 0) {
      CVar5 = Curl_sasl_parse_url_auth_option((SASL *)sasl,value,len);
      CVar6 = CURLE_OK;
      if ((CVar5 != CURLE_OK) &&
         (iVar4 = Curl_strncasecompare(value,"+APOP",len), CVar6 = CVar5, iVar4 != 0)) {
        (conn->proto).ftpc.count1 = 2;
        (conn->proto).imapc.preftype = 0;
        CVar6 = CURLE_OK;
      }
    }
    first = pcVar7 + (*pcVar7 == ';');
  }
  bVar8 = true;
LAB_00131b7b:
  if ((conn->proto).ftpc.count1 != 2) {
    uVar2 = (conn->proto).imapc.preftype;
    iVar4 = (uint)(uVar2 != 0xffffffdf) * 5 + -1;
    if (uVar2 == 0) {
      iVar4 = 0;
    }
    (conn->proto).ftpc.count1 = iVar4;
  }
  if (!bVar8) {
    return CVar6;
  }
  (conn->proto).imapc.state = IMAP_SERVERGREET;
  CVar6 = pop3_multi_statemach(conn,done);
  return CVar6;
}

Assistant:

static CURLcode pop3_connect(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in POP3 */
  connkeep(conn, "POP3 default");

  /* Set the default response time-out */
  pp->response_time = RESP_TIMEOUT;
  pp->statemach_act = pop3_statemach_act;
  pp->endofresp = pop3_endofresp;
  pp->conn = conn;

  /* Set the default preferred authentication type and mechanism */
  pop3c->preftype = POP3_TYPE_ANY;
  Curl_sasl_init(&pop3c->sasl, &saslpop3);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = pop3_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  state(conn, POP3_SERVERGREET);

  result = pop3_multi_statemach(conn, done);

  return result;
}